

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

char * make_GLSL_swizzle_string(char *swiz_str,size_t strsize,int swizzle,int writemask)

{
  int iVar1;
  int swizzle_w;
  int swizzle_z;
  int swizzle_y;
  int swizzle_x;
  int writemask3;
  int writemask2;
  int writemask1;
  int writemask0;
  size_t i;
  int writemask_local;
  int swizzle_local;
  size_t strsize_local;
  char *swiz_str_local;
  
  _writemask1 = 0;
  iVar1 = no_swizzle(swizzle);
  if ((iVar1 == 0) || (iVar1 = writemask_xyzw(writemask), iVar1 == 0)) {
    _writemask1 = 1;
    *swiz_str = '.';
    if ((writemask & 1U) != 0) {
      _writemask1 = 2;
      swiz_str[1] = "xyzw"[(int)(swizzle & 3)];
    }
    if ((writemask >> 1 & 1U) != 0) {
      swiz_str[_writemask1] = "xyzw"[(int)(swizzle >> 2 & 3)];
      _writemask1 = _writemask1 + 1;
    }
    if ((writemask >> 2 & 1U) != 0) {
      swiz_str[_writemask1] = "xyzw"[(int)(swizzle >> 4 & 3)];
      _writemask1 = _writemask1 + 1;
    }
    if ((writemask >> 3 & 1U) != 0) {
      swiz_str[_writemask1] = "xyzw"[(int)(swizzle >> 6 & 3)];
      _writemask1 = _writemask1 + 1;
    }
  }
  if (strsize <= _writemask1) {
    __assert_fail("i < strsize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                  ,0x7b1,
                  "char *make_GLSL_swizzle_string(char *, const size_t, const int, const int)");
  }
  swiz_str[_writemask1] = '\0';
  return swiz_str;
}

Assistant:

static char *make_GLSL_swizzle_string(char *swiz_str, const size_t strsize,
                                      const int swizzle, const int writemask)
{
    size_t i = 0;
    if ( (!no_swizzle(swizzle)) || (!writemask_xyzw(writemask)) )
    {
        const int writemask0 = (writemask >> 0) & 0x1;
        const int writemask1 = (writemask >> 1) & 0x1;
        const int writemask2 = (writemask >> 2) & 0x1;
        const int writemask3 = (writemask >> 3) & 0x1;

        const int swizzle_x = (swizzle >> 0) & 0x3;
        const int swizzle_y = (swizzle >> 2) & 0x3;
        const int swizzle_z = (swizzle >> 4) & 0x3;
        const int swizzle_w = (swizzle >> 6) & 0x3;

        swiz_str[i++] = '.';
        if (writemask0) swiz_str[i++] = swizzle_channels[swizzle_x];
        if (writemask1) swiz_str[i++] = swizzle_channels[swizzle_y];
        if (writemask2) swiz_str[i++] = swizzle_channels[swizzle_z];
        if (writemask3) swiz_str[i++] = swizzle_channels[swizzle_w];
    } // if
    assert(i < strsize);
    swiz_str[i] = '\0';
    return swiz_str;
}